

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O3

bool __thiscall CSemaphore::try_wait(CSemaphore *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    iVar2 = this->value;
    if (0 < iVar2) {
      this->value = iVar2 + -1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
      return 0 < iVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar2);
  }
  __stack_chk_fail();
}

Assistant:

bool try_wait() noexcept
    {
        std::lock_guard<std::mutex> lock(mutex);
        if (value < 1) {
            return false;
        }
        value--;
        return true;
    }